

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

int __thiscall EntryBTree::lessThanKeyCompareOp(EntryBTree *this,KeyType *key,uint8_t *data)

{
  uint uVar1;
  uint64_t uVar2;
  uint8_t *data_local;
  
  data_local = data;
  uVar2 = decodeBitsAndAdvance(&data_local);
  if (key->m_nameIndex < (uint)uVar2) {
    uVar1 = 0xffffffff;
  }
  else if ((uint)uVar2 < key->m_nameIndex) {
    uVar1 = 1;
  }
  else {
    uVar2 = decodeBitsAndAdvance(&data_local);
    uVar1 = -(uint)(key->m_extIndex < (uint)uVar2) | 1;
  }
  return uVar1;
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto nameIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nameIndex() < nameIndex)
			return -1;
		else if (key.nameIndex() > nameIndex)
			return 1;
		
		const auto extIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.extIndex() < extIndex)
			return -1;
		else if (key.extIndex() > extIndex)
			return 1;
		else
			UNREACHABLE_CODE(0xDEAD);
	}